

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O1

char * Bbl_ManTruthToSop(uint *pTruth,int nVars)

{
  uint uVar1;
  char *__s;
  uint uVar2;
  long lVar3;
  char *pcVar4;
  char *__size;
  uint uVar5;
  
  if (0x10 < (uint)nVars) {
    __assert_fail("nVars >= 0 && nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/bbl/bblif.c"
                  ,0x4fd,"char *Bbl_ManTruthToSop(unsigned int *, int)");
  }
  uVar2 = 1 << ((byte)nVars & 0x1f);
  uVar1 = 0;
  uVar5 = 0;
  do {
    uVar5 = uVar5 + ((pTruth[uVar1 >> 5] >> (uVar1 & 0x1f) & 1) != 0);
    uVar1 = uVar1 + 1;
  } while (uVar2 != uVar1);
  if (uVar5 == 0 || uVar5 == uVar2) {
    __s = (char *)malloc((size_t)(ulong)(nVars + 4));
    pcVar4 = __s;
    if (nVars != 0) {
      memset(__s,0x2d,(ulong)(uint)nVars);
      pcVar4 = __s + (uint)nVars;
    }
    *pcVar4 = ' ';
    pcVar4[1] = uVar5 == 0 ^ 0x31;
    pcVar4[2] = '\n';
    pcVar4[3] = '\0';
    if (pcVar4 + (4 - (long)__s) != (char *)(ulong)(nVars + 4)) {
      __assert_fail("pTemp - pResult == nVars + 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/bbl/bblif.c"
                    ,0x50d,"char *Bbl_ManTruthToSop(unsigned int *, int)");
    }
  }
  else {
    __size = (char *)(long)(int)(uVar5 * (nVars + 3) + 1);
    __s = (char *)malloc((size_t)__size);
    uVar1 = 0;
    pcVar4 = __s;
    do {
      if ((pTruth[uVar1 >> 5] >> (uVar1 & 0x1f) & 1) != 0) {
        if (nVars != 0) {
          lVar3 = 0;
          do {
            pcVar4[lVar3] = (uVar1 >> ((uint)lVar3 & 0x1f) & 1) == 0 ^ 0x31;
            lVar3 = lVar3 + 1;
          } while (nVars != (int)lVar3);
          pcVar4 = pcVar4 + lVar3;
        }
        pcVar4[0] = ' ';
        pcVar4[1] = '1';
        pcVar4[2] = '\n';
        pcVar4 = pcVar4 + 3;
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 != uVar2);
    *pcVar4 = '\0';
    if (pcVar4 + (1 - (long)__s) != __size) {
      __assert_fail("pTemp - pResult == nOnes * (nVars + 3) + 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/bbl/bblif.c"
                    ,0x51c,"char *Bbl_ManTruthToSop(unsigned int *, int)");
    }
  }
  return __s;
}

Assistant:

char * Bbl_ManTruthToSop( unsigned * pTruth, int nVars )
{
    char * pResult, * pTemp;
    int nMints, nOnes, b, v;
    assert( nVars >= 0 && nVars <= 16 );
    nMints = (1 << nVars);
    // count the number of ones
    nOnes = 0;
    for ( b = 0; b < nMints; b++ )
        nOnes += ((pTruth[b>>5] >> (b&31)) & 1);
    // handle constants
    if ( nOnes == 0 || nOnes == nMints )
    {
        pResult = pTemp = BBLIF_ALLOC( char, nVars + 4 );        
        for ( v = 0; v < nVars; v++ )
            *pTemp++ = '-';
        *pTemp++ = ' ';
        *pTemp++ = nOnes? '1' : '0';
        *pTemp++ = '\n';
        *pTemp++ = 0;
        assert( pTemp - pResult == nVars + 4 );
        return pResult;
    }
    pResult = pTemp = BBLIF_ALLOC( char, nOnes * (nVars + 3) + 1 );        
    for ( b = 0; b < nMints; b++ )
    {
        if ( ((pTruth[b>>5] >> (b&31)) & 1) == 0 )
            continue;
        for ( v = 0; v < nVars; v++ )
            *pTemp++ = ((b >> v) & 1)? '1' : '0';
        *pTemp++ = ' ';
        *pTemp++ = '1';
        *pTemp++ = '\n';
    }
    *pTemp++ = 0;
    assert( pTemp - pResult == nOnes * (nVars + 3) + 1 );
    return pResult;
}